

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

void __thiscall boundingBoxTy::enlarge_m(boundingBoxTy *this,double x,double y)

{
  uint uVar1;
  positionTy *in_XMM0_Qa;
  positionTy *in_XMM1_Qa;
  double d;
  vectorTy local_60;
  vectorTy local_40;
  double local_20;
  positionTy *vec;
  
  uVar1 = std::isnan((double)in_XMM1_Qa);
  vec = in_XMM0_Qa;
  if ((uVar1 & 1) == 0) {
    vec = in_XMM1_Qa;
  }
  local_20 = sqrt((double)in_XMM0_Qa * (double)in_XMM0_Qa + (double)vec * (double)vec);
  vectorTy::vectorTy(&local_40,315.0,local_20,NAN,NAN);
  positionTy::operator+=(in_XMM0_Qa,(vectorTy *)vec);
  vectorTy::vectorTy(&local_60,135.0,local_20,NAN,NAN);
  positionTy::operator+=(in_XMM0_Qa,(vectorTy *)vec);
  return;
}

Assistant:

void boundingBoxTy::enlarge_m (double x, double y)
{
    // height defaults to width
    if (std::isnan(y)) y = x;
    
    // we move 45 degrees from the center point to the nw and se corners,
    // use good ole pythagoras, probably not _exact_ but good enough here
    const double d = sqrt(x*x + y*y);
    
    // let's move the corners out:
    nw += vectorTy ( 315, d, NAN, NAN );
    se += vectorTy ( 135, d, NAN, NAN );
}